

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void helper_lldt_x86_64(CPUX86State *env,int selector)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint mmu_idx;
  int exception_index;
  uint mmu_idx_00;
  uint uVar5;
  abi_ptr addr;
  uintptr_t unaff_retaddr;
  
  uVar5 = selector & 0xfffc;
  if (uVar5 == 0) {
    (env->ldt).base = 0;
    (env->ldt).limit = 0;
LAB_0051e7dd:
    (env->ldt).selector = selector & 0xffff;
    return;
  }
  if ((selector & 4U) == 0) {
    uVar4 = env->hflags;
    if ((uVar4 >> 0xb & 8) + (selector & 0xfff8U) + 7 <= (env->gdt).limit) {
      mmu_idx_00 = 2;
      mmu_idx = 2;
      addr = (ulong)(selector & 0xfff8U) + (env->gdt).base;
      if (((uVar4 >> 0x17 & 1) != 0) && (mmu_idx = 0, (~uVar4 & 3) != 0)) {
        mmu_idx = (uint)env->eflags >> 0x11 & 2;
      }
      uVar1 = cpu_ldl_mmuidx_ra_x86_64(env,addr,mmu_idx,unaff_retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (mmu_idx_00 = 0, (~env->hflags & 3) != 0)) {
        mmu_idx_00 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,mmu_idx_00,unaff_retaddr);
      if ((uVar2 & 0x1f00) == 0x200) {
        if ((short)uVar2 < 0) {
          uVar5 = env->hflags;
          if ((uVar5 >> 0xe & 1) == 0) {
            (env->ldt).base = (ulong)(uVar2 & 0xff000000 | uVar1 >> 0x10 | (uVar2 & 0xff) << 0x10);
            uVar4 = uVar2 & 0xf0000 | uVar1 & 0xffff;
            uVar5 = uVar4 << 0xc | 0xfff;
            if ((uVar2 >> 0x17 & 1) == 0) {
              uVar5 = uVar4;
            }
            (env->ldt).limit = uVar5;
            (env->ldt).flags = uVar2;
          }
          else {
            uVar4 = 2;
            if (((uVar5 >> 0x17 & 1) != 0) && (uVar4 = 0, (~uVar5 & 3) != 0)) {
              uVar4 = (uint)env->eflags >> 0x11 & 2;
            }
            uVar3 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 8,uVar4,unaff_retaddr);
            uVar4 = uVar2 & 0xf0000 | uVar1 & 0xffff;
            uVar5 = uVar4 << 0xc | 0xfff;
            if ((uVar2 >> 0x17 & 1) == 0) {
              uVar5 = uVar4;
            }
            (env->ldt).limit = uVar5;
            (env->ldt).flags = uVar2;
            (env->ldt).base =
                 CONCAT44(uVar3,uVar2 & 0xff000000 | uVar1 >> 0x10 | (uVar2 & 0xff) << 0x10);
          }
          goto LAB_0051e7dd;
        }
        exception_index = 0xb;
      }
      else {
        exception_index = 0xd;
      }
      raise_exception_err_ra_x86_64(env,exception_index,uVar5,unaff_retaddr);
    }
  }
  raise_exception_err_ra_x86_64(env,0xd,uVar5,unaff_retaddr);
}

Assistant:

void helper_lldt(CPUX86State *env, int selector)
{
    SegmentCache *dt;
    uint32_t e1, e2;
    int index, entry_limit;
    target_ulong ptr;

    selector &= 0xffff;
    if ((selector & 0xfffc) == 0) {
        /* XXX: NULL selector case: invalid LDT */
        env->ldt.base = 0;
        env->ldt.limit = 0;
    } else {
        if (selector & 0x4) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        dt = &env->gdt;
        index = selector & ~7;
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            entry_limit = 15;
        } else
#endif
        {
            entry_limit = 7;
        }
        if ((index + entry_limit) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());
        if ((e2 & DESC_S_MASK) || ((e2 >> DESC_TYPE_SHIFT) & 0xf) != 2) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
        }
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            uint32_t e3;

            e3 = cpu_ldl_kernel_ra(env, ptr + 8, GETPC());
            load_seg_cache_raw_dt(&env->ldt, e1, e2);
            env->ldt.base |= (target_ulong)e3 << 32;
        } else
#endif
        {
            load_seg_cache_raw_dt(&env->ldt, e1, e2);
        }
    }
    env->ldt.selector = selector;
}